

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZVTKGeoMesh.cpp
# Opt level: O3

void TPZVTKGeoMesh::SetMaterialVTK(TPZGeoEl *gel,int mat)

{
  TPZGeoMesh *pTVar1;
  int iVar2;
  long lVar3;
  int64_t nelem;
  TPZGeoNode *this;
  TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *this_00;
  TPZGeoEl *gel_00;
  int iVar4;
  ulong uVar5;
  TPZVec<long> Topol;
  TPZVec<double> NodeCoord;
  TPZVec<long> local_70;
  TPZVec<double> local_50;
  
  gel->fMatId = mat;
  iVar2 = (**(code **)(*(long *)gel + 0x90))();
  if (0 < iVar2) {
    uVar5 = 0;
    do {
      TPZVec<double>::TPZVec(&local_50,3);
      TPZVec<long>::TPZVec(&local_70,1);
      lVar3 = (**(code **)(*(long *)gel + 0xa8))(gel,uVar5 & 0xffffffff);
      *local_70.fStore = lVar3;
      pTVar1 = gel->fMesh;
      nelem = (**(code **)(*(long *)gel + 0xa8))(gel,uVar5 & 0xffffffff);
      this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(pTVar1->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,nelem);
      TPZGeoNode::GetCoordinates(this,&local_50);
      this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *)operator_new(0x90);
      TPZGeoElRefPattern<pzgeom::TPZGeoPoint>::TPZGeoElRefPattern
                (this_00,0,&local_70,mat,gel->fMesh);
      local_70._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_70.fStore != (long *)0x0) {
        operator_delete__(local_70.fStore);
      }
      local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      if (local_50.fStore != (double *)0x0) {
        operator_delete__(local_50.fStore);
      }
      uVar5 = uVar5 + 1;
    } while ((long)iVar2 != uVar5);
  }
  iVar2 = (**(code **)(*(long *)gel + 0x1d0))(gel);
  if (iVar2 != 0) {
    iVar2 = (**(code **)(*(long *)gel + 0x148))(gel);
    if (0 < iVar2) {
      iVar4 = 0;
      do {
        gel_00 = (TPZGeoEl *)(**(code **)(*(long *)gel + 0x1f8))(gel,iVar4);
        SetMaterialVTK(gel_00,mat);
        iVar4 = iVar4 + 1;
      } while (iVar2 != iVar4);
    }
  }
  return;
}

Assistant:

void TPZVTKGeoMesh::SetMaterialVTK(TPZGeoEl * gel, int mat) {
    gel->SetMaterialId(mat);

    int64_t nnodes = gel->NNodes();
    for (int64_t nd = 0; nd < nnodes; nd++) {
        TPZVec<REAL> NodeCoord(3);
        TPZVec<int64_t> Topol(1);

        int64_t elIndex = 0;

        Topol[0] = gel->NodeIndex(nd);

        gel->Mesh()->NodeVec()[gel->NodeIndex(nd)].GetCoordinates(NodeCoord);
        new TPZGeoElRefPattern< pzgeom::TPZGeoPoint > (elIndex, Topol, mat, *(gel->Mesh()));
    }

    if (gel->HasSubElement()) {
        int nSons = gel->NSubElements();
        for (int s = 0; s < nSons; s++) {
            TPZGeoEl * son = gel->SubElement(s);
            SetMaterialVTK(son, mat);
        }
    }
}